

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O1

string * __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,unsigned_char>::
getVertexShaderCode_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  int iVar1;
  ostream *poVar2;
  TestError *this_00;
  char *pcVar3;
  string coordType;
  string coordAssignment;
  stringstream result;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  char *local_1c8;
  char *local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  local_1e0 = 0;
  local_1d8 = '\0';
  local_1c0 = (char *)0x0;
  local_1b8 = '\0';
  iVar1 = *(int *)((long)this + 0x2d8);
  local_1e8 = &local_1d8;
  local_1c8 = &local_1b8;
  if ((iVar1 == 0x8c1a) || (iVar1 == 0x806f)) {
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x1b70573);
    pcVar3 = "vec3(texture_coords_in, layer)";
  }
  else {
    if (iVar1 != 0xde1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed texture target!",fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x37c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,0x1b70554);
    pcVar3 = "texture_coords_in";
  }
  std::__cxx11::string::_M_replace((ulong)&local_1c8,0,local_1c0,(ulong)pcVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "${VERSION}\n\nprecision highp float;\n\nlayout (location = 0) in vec4 vertex_position_in;\nlayout (location = 1) in vec2 texture_coords_in;\nout "
             ,0x8b);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1e8,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             " texture_coords_out;\nuniform float layer;\n\nvoid main()\n{\n    gl_Position = vertex_position_in;\n    texture_coords_out = "
             ,0x78);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1c8,(long)local_1c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,";\n}\n",4);
  std::__cxx11::stringbuf::str();
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  if (local_1e8 != &local_1d8) {
    operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getVertexShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  coordAssignment;

	/* Check input texture target and prepare approperiate coordinate type and coordinate assignment method */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType		= "vec2";
		coordAssignment = "texture_coords_in";
		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		coordType		= "vec3";
		coordAssignment = "vec3(texture_coords_in, layer)";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout (location = 0) in vec4 vertex_position_in;\n"
			  "layout (location = 1) in vec2 texture_coords_in;\n"
			  "out "
		   << coordType << " texture_coords_out;\n"
						   "uniform float layer;\n"
						   "\n"
						   "void main()\n"
						   "{\n"
						   "    gl_Position = vertex_position_in;\n"
						   "    texture_coords_out = "
		   << coordAssignment << ";\n"
								 "}\n";

	return result.str();
}